

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O0

pair<sjtu::trainType_*,_long> __thiscall
sjtu::DynamicFileManager<sjtu::trainType>::newspace(DynamicFileManager<sjtu::trainType> *this)

{
  char *pcVar1;
  trainType *ptVar2;
  trainType *in_RDI;
  pair<sjtu::trainType_*,_long> pVar3;
  trainType tmp;
  locType offset_;
  locType offset;
  long *in_stack_ffffffffffff57e8;
  fpos<__mbstate_t> *in_stack_ffffffffffff57f0;
  trainType **__x;
  undefined8 local_a7f0;
  undefined8 local_a7e8;
  fpos local_a7e0 [16];
  undefined1 local_a7d0 [42920];
  trainType *local_28;
  trainType *local_20;
  trainType *offset_00;
  LRUCache<sjtu::trainType> *in_stack_fffffffffffffff0;
  
  offset_00 = in_RDI;
  trainType::trainType(in_RDI);
  std::istream::seekg((long)(in_RDI->trainID + 8),_S_beg);
  std::istream::read(in_RDI->trainID + 8,(long)&local_20);
  std::ostream::seekp((long)&in_RDI->stationNum,_S_beg);
  std::ios::clear(in_RDI->trainID + *(long *)(*(long *)(in_RDI->trainID + 8) + -0x18) + 8,0);
  local_a7e0 = (fpos  [16])std::ostream::tellp();
  ptVar2 = (trainType *)std::fpos::operator_cast_to_long(local_a7e0);
  if (ptVar2 == local_20) {
    std::ostream::write((char *)&in_RDI->stationNum,(long)local_a7d0);
    local_28 = local_20 + 1;
    std::ostream::seekp((long)&in_RDI->stationNum,_S_beg);
    std::ostream::write((char *)&in_RDI->stationNum,(long)local_a7d0);
    std::ostream::seekp((long)&in_RDI->stationNum,0xffff5858);
    std::ostream::write((char *)&in_RDI->stationNum,(long)&local_28);
  }
  else {
    pcVar1 = in_RDI->trainID;
    std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffff57f0,(streamoff)in_stack_ffffffffffff57e8);
    std::istream::seekg(pcVar1 + 8,local_a7f0,local_a7e8);
    std::istream::read(in_RDI->trainID + 8,(long)&local_28);
    std::ostream::seekp((long)&in_RDI->stationNum,_S_beg);
    std::ostream::write((char *)&in_RDI->stationNum,(long)&local_28);
  }
  __x = &local_20;
  LRUCache<sjtu::trainType>::load(in_stack_fffffffffffffff0,(locType *)offset_00);
  pVar3 = std::make_pair<sjtu::trainType*,long&>(__x,in_stack_ffffffffffff57e8);
  return pVar3;
}

Assistant:

virtual std::pair<T * , locType> newspace() override
		{
			locType offset , offset_;T tmp;
			file.seekg(0 , std::ios_base::beg) , file.read(reinterpret_cast<char *> (&offset) , sizeof (locType));
			file.seekp(0 , std::ios_base::end) , file.clear();
			if (file.tellp() == offset)
			{
				file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				offset_ = offset + sizeof (T) , file.seekp(0 , std::ios_base::beg);
				file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				file.seekp(- sizeof (T) , std::ios_base::cur) , file.write(reinterpret_cast<char *> (&offset_) , sizeof (locType));
			}
			else
			{
				file.seekg(offset) , file.read(reinterpret_cast<char *> (&offset_) , sizeof (locType));
				//file.seekp(offset) , file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				file.seekp(0 , std::ios_base::beg) , file.write(reinterpret_cast<char *> (&offset_) , sizeof (locType));
			}
			return std::make_pair(cache -> load(offset) , offset);
		}